

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O2

void __thiscall
dynamicgraph::SignalPtr<double,int>::displayDependencies(SignalPtr<double,int> *this)

{
  string *in_RCX;
  int in_EDX;
  ostream *in_RSI;
  string *in_R8;
  string *in_R9;
  
  SignalPtr<double,_int>::displayDependencies
            ((SignalPtr<double,_int> *)(this + *(long *)(*(long *)this + -0x68)),in_RSI,in_EDX,
             in_RCX,in_R8,in_R9);
  return;
}

Assistant:

std::ostream &SignalPtr<T, Time>::displayDependencies(std::ostream &os,
                                                      const int depth,
                                                      std::string space,
                                                      std::string next1,
                                                      std::string next2) const {
  dgTDEBUGIN(25);
  if ((isAbstractPluged()) && (!autoref())) {
    getAbstractPtr()->displayDependencies(
        os, depth, space, next1 + "-- " + SignalBase<Time>::name + " -->",
        next2);
  } else {
    SignalBase<Time>::displayDependencies(os, depth, space, next1, next2);
  }
  dgTDEBUGOUT(25);
  return os;
}